

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall google::protobuf::RepeatedField<long>::RemoveLast(RepeatedField<long> *this)

{
  int *in_RDI;
  
  *in_RDI = *in_RDI + -1;
  return;
}

Assistant:

inline void RepeatedField<Element>::RemoveLast() {
  GOOGLE_DCHECK_GT(current_size_, 0);
  current_size_--;
}